

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.cpp
# Opt level: O2

char * ht_search(ht_hash_table *ht,char *key)

{
  ht_item *phVar1;
  int iVar2;
  int iVar3;
  ht_item **pphVar4;
  
  iVar2 = ht_get_hash(key,ht->size,0);
  pphVar4 = ht->items + iVar2;
  iVar2 = 1;
  while( true ) {
    phVar1 = *pphVar4;
    if (phVar1 == (ht_item *)0x0) {
      return (char *)0x0;
    }
    if ((phVar1 != &HT_DELETED_ITEM) && (iVar3 = strcmp(phVar1->key,key), iVar3 == 0)) break;
    iVar3 = ht_get_hash(key,ht->size,iVar2);
    pphVar4 = ht->items + iVar3;
    iVar2 = iVar2 + 1;
  }
  return phVar1->value;
}

Assistant:

char* ht_search(ht_hash_table* ht, const char* key) {
    int index = ht_get_hash(key, ht->size, 0);
    ht_item* item = ht->items[index];
    int i = 1;
    while (item != nullptr) {
        if (item != &HT_DELETED_ITEM) {
            if (strcmp(item->key, key) == 0) {
                return item->value;
            }
        }
        index = ht_get_hash(key, ht->size, i);
        item = ht->items[index];
        i++;
    }
    return nullptr;
}